

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

void __thiscall HandleTpl::HandleTpl(HandleTpl *this,VarnodeTpl *vn)

{
  anon_union_8_2_16792c89_for_value aVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  const_type cVar4;
  undefined4 uVar5;
  ConstTpl local_38;
  
  (this->space).type = real;
  (this->space).value_real = 0;
  (this->size).type = real;
  (this->size).value_real = 0;
  (this->ptrspace).type = real;
  (this->ptrspace).value_real = 0;
  (this->ptroffset).type = real;
  (this->ptroffset).value_real = 0;
  (this->ptrsize).type = real;
  (this->ptrsize).value_real = 0;
  (this->temp_space).type = real;
  (this->temp_space).value_real = 0;
  (this->temp_offset).type = real;
  (this->temp_offset).value_real = 0;
  cVar4 = (vn->space).type;
  uVar5 = *(undefined4 *)&(vn->space).field_0x4;
  aVar1 = (vn->space).value;
  uVar2 = *(undefined8 *)((long)&(vn->space).value_real + 4);
  *(undefined8 *)((long)&(this->space).value + 4) = *(undefined8 *)((long)&(vn->space).value + 4);
  *(undefined8 *)((long)&(this->space).value_real + 4) = uVar2;
  (this->space).type = cVar4;
  *(undefined4 *)&(this->space).field_0x4 = uVar5;
  (this->space).value = aVar1;
  uVar5 = *(undefined4 *)&(vn->size).field_0x4;
  aVar1 = (vn->size).value;
  uVar2 = *(undefined8 *)((long)&(vn->size).value + 4);
  uVar3 = *(undefined8 *)((long)&(vn->size).value_real + 4);
  (this->size).type = (vn->size).type;
  *(undefined4 *)&(this->size).field_0x4 = uVar5;
  (this->size).value = aVar1;
  *(undefined8 *)((long)&(this->size).value + 4) = uVar2;
  *(undefined8 *)((long)&(this->size).value_real + 4) = uVar3;
  ConstTpl::ConstTpl(&local_38,real,0);
  aVar1._4_4_ = local_38.value._4_4_;
  aVar1.handle_index = local_38.value.handle_index;
  *(ulong *)((long)&(this->ptrspace).value + 4) =
       CONCAT44((undefined4)local_38.value_real,local_38.value._4_4_);
  *(undefined8 *)((long)&(this->ptrspace).value_real + 4) = local_38._20_8_;
  (this->ptrspace).type = local_38.type;
  *(undefined4 *)&(this->ptrspace).field_0x4 = local_38._4_4_;
  (this->ptrspace).value = aVar1;
  cVar4 = (vn->offset).type;
  uVar5 = *(undefined4 *)&(vn->offset).field_0x4;
  aVar1 = (vn->offset).value;
  uVar2 = *(undefined8 *)((long)&(vn->offset).value_real + 4);
  *(undefined8 *)((long)&(this->ptroffset).value + 4) =
       *(undefined8 *)((long)&(vn->offset).value + 4);
  *(undefined8 *)((long)&(this->ptroffset).value_real + 4) = uVar2;
  (this->ptroffset).type = cVar4;
  *(undefined4 *)&(this->ptroffset).field_0x4 = uVar5;
  (this->ptroffset).value = aVar1;
  return;
}

Assistant:

HandleTpl::HandleTpl(const VarnodeTpl *vn)

{				// Build handle which indicates given varnode
  space = vn->getSpace();
  size = vn->getSize();
  ptrspace = ConstTpl(ConstTpl::real,0);
  ptroffset = vn->getOffset();
}